

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

void __thiscall Liby::TimerQueue::TimerQueue(TimerQueue *this,Poller *poller)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Poller *pPVar1;
  FileDescriptor *pFVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  pointer __p;
  Logger *pLVar5;
  int *piVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined1 local_29;
  FileDescriptor *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  (this->timerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->timerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->timerChan_)._M_t.super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>.
  _M_t.super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
  super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl = (Channel *)0x0;
  this->poller_ = poller;
  BinaryHeap<Liby::WeakTimerHolder>::BinaryHeap(&this->queue_,100);
  if (this->poller_ == (Poller *)0x0) {
    pLVar5 = Logger::getLogger();
    Logger::log(pLVar5,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  else {
    iVar4 = timerfd_create(0,0x80800);
    this->timerfd_ = iVar4;
    if (-1 < iVar4) {
      local_28 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Liby::FileDescriptor,std::allocator<Liby::FileDescriptor>,int&>
                (&_Stack_20,&local_28,(allocator<Liby::FileDescriptor> *)&local_29,&this->timerfd_);
      _Var3._M_pi = _Stack_20._M_pi;
      pFVar2 = local_28;
      local_28 = (FileDescriptor *)0x0;
      _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this->timerfp_).
                super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->timerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pFVar2;
      (this->timerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var3._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
      }
      __p = (pointer)operator_new(0x70);
      pPVar1 = this->poller_;
      iVar4 = this->timerfd_;
      (__p->erroEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (__p->erroEventCallback_)._M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__p->erroEventCallback_).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(__p->erroEventCallback_).super__Function_base._M_functor + 8) = 0;
      (__p->writEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (__p->writEventCallback_)._M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__p->writEventCallback_).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(__p->writEventCallback_).super__Function_base._M_functor + 8) = 0;
      (__p->readEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (__p->readEventCallback_)._M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__p->readEventCallback_).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(__p->readEventCallback_).super__Function_base._M_functor + 8) = 0;
      __p->readable_ = false;
      __p->writable_ = false;
      __p->old_readable_ = false;
      __p->old_writable_ = false;
      __p->fd_ = iVar4;
      __p->poller_ = pPVar1;
      if ((pPVar1 != (Poller *)0x0) && (-1 < iVar4)) {
        std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
                  ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)
                   &this->timerChan_,__p);
        return;
      }
      __assert_fail("fd >= 0 && poller",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Channel.h"
                    ,0xe,"Liby::Channel::Channel(Poller *, int)");
    }
    pLVar5 = Logger::getLogger();
    piVar6 = __errno_location();
    strerror(*piVar6);
    Logger::log(pLVar5,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  }
  exit(1);
}

Assistant:

TimerQueue::TimerQueue(Poller *poller) : poller_(poller) {
#ifdef __linux__
    fatalif(poller_ == nullptr, "Poller cannot be nullptr");
    timerfd_ = ::timerfd_create(CLOCK_REALTIME, TFD_CLOEXEC | TFD_NONBLOCK);
    fatalif(timerfd_ < 0, "timerfd_create: %s", ::strerror(errno));
    timerfp_ = std::make_shared<FileDescriptor>(timerfd_);
    timerChan_ = std::make_unique<Channel>(poller_, timerfd_);
#endif
}